

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O2

void __thiscall
xemmai::t_engine::f_epoch_increment
          (t_engine *this,t_object ***a_p0,t_object ***a_p1,t_object **a_q1,t_object ***a_decrements
          )

{
  t_object *ptVar1;
  t_object **pptVar2;
  t_object *ptVar3;
  
  pptVar2 = *a_p1;
  while (pptVar2 < a_q1) {
    pptVar2 = *a_p0;
    *a_p0 = pptVar2 + 1;
    ptVar3 = *pptVar2;
    ptVar1 = **a_p1;
    if (ptVar3 != ptVar1) {
      ptVar3 = f_object__find(this,ptVar3);
      if (ptVar3 != ptVar1) {
        if (ptVar3 != (t_object *)0x0) {
          ptVar3->v_count = ptVar3->v_count + 1;
          ptVar3->v_color = c_color__BLACK;
        }
        if (ptVar1 != (t_object *)0x0) {
          pptVar2 = *a_decrements;
          *a_decrements = pptVar2 + 1;
          *pptVar2 = ptVar1;
        }
        **a_p1 = ptVar3;
      }
    }
    pptVar2 = *a_p1 + 1;
    *a_p1 = pptVar2;
  }
  return;
}

Assistant:

void f_epoch_increment(t_object**& a_p0, t_object**& a_p1, t_object** a_q1, t_object**& a_decrements)
	{
		for (; a_p1 < a_q1; ++a_p1) {
			auto p = *a_p0++;
			auto q = *a_p1;
			if (p == q) continue;
			p = f_object__find(p);
			if (p == q) continue;
			if (p) p->f_increment();
			if (q) *a_decrements++ = q;
			*a_p1 = p;
		}
	}